

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O3

void __thiscall
UnitTest::XmlTestReporter::ReportSummary
          (XmlTestReporter *this,int totalTestCount,int failedTestCount,int failureCount,
          float secondsElapsed)

{
  DeferredTestResultList *pDVar1;
  XmlTestReporter *pXVar2;
  pointer result;
  
  pXVar2 = (XmlTestReporter *)this->m_ostream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pXVar2,"<?xml version=\"1.0\"",0x13)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pXVar2,"?>",2);
  BeginResults(pXVar2,this->m_ostream,totalTestCount,failedTestCount,failureCount,secondsElapsed);
  pXVar2 = this;
  pDVar1 = DeferredTestReporter::GetResults(&this->super_DeferredTestReporter);
  result = (pDVar1->
           super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (result != (pDVar1->
                super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      BeginTest(pXVar2,this->m_ostream,result);
      if (result->failed == true) {
        AddFailure(pXVar2,this->m_ostream,result);
      }
      EndTest(pXVar2,this->m_ostream,result);
      result = result + 1;
    } while (result != (pDVar1->
                       super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->m_ostream,"</unittest-results>",0x13);
  return;
}

Assistant:

void XmlTestReporter::ReportSummary(int totalTestCount, int failedTestCount,
                                    int failureCount, float secondsElapsed)
{
    AddXmlElement(m_ostream, NULL);

    BeginResults(m_ostream, totalTestCount, failedTestCount, failureCount, secondsElapsed);

    DeferredTestResultList const& results = GetResults();
    for (DeferredTestResultList::const_iterator i = results.begin(); i != results.end(); ++i)
    {
        BeginTest(m_ostream, *i);

        if (i->failed)
            AddFailure(m_ostream, *i);

        EndTest(m_ostream, *i);
    }

    EndResults(m_ostream);
}